

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_start_bin(mpack_writer_t *writer,uint32_t count)

{
  _Bool _Var1;
  uint8_t *u;
  char *pcVar2;
  ulong uVar3;
  
  if (writer->version < mpack_version_current) {
    mpack_start_str_notrack(writer,count);
    return;
  }
  if (count < 0x100) {
    pcVar2 = writer->current;
    if ((ulong)((long)writer->end - (long)pcVar2) < 2) {
      _Var1 = mpack_writer_ensure(writer,2);
      if (!_Var1) {
        return;
      }
      pcVar2 = writer->current;
    }
    *pcVar2 = -0x3c;
    pcVar2[1] = (char)count;
    writer->current = writer->current + 2;
  }
  else {
    pcVar2 = writer->current;
    uVar3 = (long)writer->end - (long)pcVar2;
    if (count < 0x10000) {
      if (uVar3 < 3) {
        _Var1 = mpack_writer_ensure(writer,3);
        if (!_Var1) {
          return;
        }
        pcVar2 = writer->current;
      }
      *pcVar2 = -0x3b;
      *(ushort *)(pcVar2 + 1) = (ushort)count << 8 | (ushort)count >> 8;
      writer->current = writer->current + 3;
    }
    else {
      if (uVar3 < 5) {
        _Var1 = mpack_writer_ensure(writer,5);
        if (!_Var1) {
          return;
        }
        pcVar2 = writer->current;
      }
      *pcVar2 = -0x3a;
      *(uint32_t *)(pcVar2 + 1) =
           count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
      writer->current = writer->current + 5;
    }
  }
  return;
}

Assistant:

void mpack_start_bin(mpack_writer_t* writer, uint32_t count) {
    mpack_writer_track_element(writer);
    mpack_start_bin_notrack(writer, count);
    mpack_writer_track_push(writer, mpack_type_bin, count);
}